

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O1

int luaopen_jit(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t features [4];
  uint32_t vendor [4];
  uint local_38 [2];
  uint local_30;
  uint local_2c;
  undefined1 local_28 [8];
  int local_20;
  
  lua_pushlstring(L,"Linux",5);
  lua_pushlstring(L,"x64",3);
  L->top->u64 = 0x40d3890000000000;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar1 + 1) {
    lj_state_growstack(L,1);
  }
  lua_pushlstring(L,"LuaJIT 2.0.4",0xc);
  lj_lib_register(L,"jit",lj_lib_init_jit,lj_lib_cf_jit);
  lj_lib_register(L,"jit.util",lj_lib_init_jit_util,lj_lib_cf_jit_util);
  lj_lib_register(L,"jit.opt",lj_lib_init_jit_opt,lj_lib_cf_jit_opt);
  L->top = L->top + -2;
  iVar2 = lj_vm_cpuid(0,local_28);
  uVar5 = 0;
  if ((iVar2 != 0) && (iVar2 = lj_vm_cpuid(1,local_38), uVar5 = 0, iVar2 != 0)) {
    uVar4 = local_30 >> 0xc & 0x80 |
            (local_30 & 1) << 6 | local_2c >> 0x15 & 0x20 | local_2c >> 0xb & 0x10;
    if (local_20 == 0x444d4163) {
      uVar5 = uVar4 + 0x400;
      if ((local_38[0] & 0xff00f00) != 0xf00) {
        uVar5 = uVar4;
      }
      uVar5 = uVar5 | 0x200;
      if ((local_38[0] & 0xff00f00) < 0xf00) {
        uVar5 = uVar4;
      }
    }
    else {
      uVar5 = uVar4;
      if (local_20 == 0x6c65746e) {
        if ((local_38[0] & 0xff00f00) == 0xf00) {
          uVar5 = uVar4 | 0x100;
        }
        else {
          uVar5 = uVar4 + 0x800;
          if ((local_38[0] & 0xfff0ff0) != 0x106c0) {
            uVar5 = uVar4;
          }
        }
      }
    }
  }
  uVar3 = (ulong)(L->glref).ptr32;
  *(uint *)(uVar3 + 0x220) = uVar5 | 0x3ff0001;
  ((int32_t *)(uVar3 + 0x790))[0] = 1000;
  ((int32_t *)(uVar3 + 0x790))[1] = 4000;
  ((int32_t *)(uVar3 + 0x798))[0] = 500;
  ((int32_t *)(uVar3 + 0x798))[1] = 100;
  ((int32_t *)(uVar3 + 0x7a0))[0] = 500;
  ((int32_t *)(uVar3 + 0x7a0))[1] = 0x38;
  ((int32_t *)(uVar3 + 0x7a8))[0] = 10;
  ((int32_t *)(uVar3 + 0x7a8))[1] = 4;
  ((int32_t *)(uVar3 + 0x7b0))[0] = 4;
  ((int32_t *)(uVar3 + 0x7b0))[1] = 0xf;
  ((int32_t *)(uVar3 + 0x7b8))[0] = 3;
  ((int32_t *)(uVar3 + 0x7b8))[1] = 2;
  *(undefined8 *)(uVar3 + 0x7c0) = 0x20000000040;
  lj_dispatch_update((global_State *)(ulong)(L->glref).ptr32);
  return 1;
}

Assistant:

LUALIB_API int luaopen_jit(lua_State *L)
{
  lua_pushliteral(L, LJ_OS_NAME);
  lua_pushliteral(L, LJ_ARCH_NAME);
  lua_pushinteger(L, LUAJIT_VERSION_NUM);
  lua_pushliteral(L, LUAJIT_VERSION);
  LJ_LIB_REG(L, LUA_JITLIBNAME, jit);
#ifndef LUAJIT_DISABLE_JITUTIL
  LJ_LIB_REG(L, "jit.util", jit_util);
#endif
#if LJ_HASJIT
  LJ_LIB_REG(L, "jit.opt", jit_opt);
#endif
  L->top -= 2;
  jit_init(L);
  return 1;
}